

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# except.hpp
# Opt level: O0

void __thiscall BCL::debug_error::~debug_error(debug_error *this)

{
  debug_error *this_local;
  
  std::__cxx11::string::~string((string *)&this->what_arg_);
  error::~error(&this->super_error);
  return;
}

Assistant:

debug_error(const std::string& what_arg) : what_arg_(what_arg) {}